

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

void Addr_ECX(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  size_t sVar1;
  size_t local_20;
  size_t i;
  PDISASM pMyDisasm_local;
  OPTYPE *pMyOperand_local;
  
  local_20 = 0;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    strcpy(pMyOperand->OpMnemonic,"(%");
    local_20 = 2;
  }
  fillModrm0Register(pMyOperand,pMyDisasm,local_20,'\x01');
  if ((pMyDisasm->Reserved_).AddressSize == 0x10) {
    (pMyOperand->Memory).BaseRegister = REGS[3];
    (pMyOperand->Memory).IndexRegister = REGS[7];
  }
  sVar1 = strlen(pMyOperand->OpMnemonic);
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    strcpy(pMyOperand->OpMnemonic + sVar1,")");
  }
  return;
}

Assistant:

void __bea_callspec__ Addr_ECX(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
  #ifndef BEA_LIGHT_DISASSEMBLY
  size_t i = 0;
  if (GV.SYNTAX_ == ATSyntax) {
    (void) strcpy((char*) pMyOperand->OpMnemonic, "(%");
    i += 2;
  }
  #endif
  fillModrm0Register(pMyOperand, pMyDisasm, i, 1);
  if (GV.AddressSize == 16) {
    pMyOperand->Memory.BaseRegister = REGS[3];
    pMyOperand->Memory.IndexRegister = REGS[7];
  }
  #ifndef BEA_LIGHT_DISASSEMBLY
    i = strlen ((char*) &pMyOperand->OpMnemonic);
    if (GV.SYNTAX_ == ATSyntax) {
      (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
      i += 1;
    }
  #endif

}